

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O3

TermList ApplicativeHelper::createAppTerm(TermList sort,TermList head,TermStack *terms)

{
  TermList s2;
  uint uVar1;
  ulong uVar2;
  TermList res;
  ulong uVar3;
  bool bVar4;
  
  uVar1 = (int)((ulong)((long)terms->_cursor - (long)terms->_stack) >> 3) - 1;
  if (-1 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
    do {
      uVar2 = (ulong)(*(uint *)(sort._content + 0xc) & 0xfffffff);
      s2._content = *(uint64_t *)(sort._content + 0x20 + uVar2 * 8);
      head = createAppTerm(*(uint64_t *)(sort._content + 0x28 + uVar2 * 8),s2,head,
                           terms->_stack[uVar3]._content,true);
      bVar4 = uVar3 != 0;
      uVar3 = uVar3 - 1;
      sort._content = s2._content;
    } while (bVar4);
  }
  return (TermList)head._content;
}

Assistant:

TermList ApplicativeHelper::createAppTerm(TermList sort, TermList head, TermStack& terms)
{
  ASS(head.isVar() || SortHelper::getResultSort(head.term()) == sort);

  TermList res = head;
  TermList s1, s2;
  
  for(int i = terms.size() - 1; i >= 0; i--){
    s1 = getNthArg(sort, 1);
    s2 = getResultApplieadToNArgs(sort, 1);
    res = createAppTerm(s1, s2, res, terms[i]);
    sort = s2;
  }
  return res; 

}